

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

uint32_t mp_decode_strbinl(char **data)

{
  byte bVar1;
  uint16_t uVar2;
  uint8_t c;
  char **data_local;
  
  bVar1 = mp_load_u8(data);
  switch(bVar1) {
  case 0xc4:
    bVar1 = mp_load_u8(data);
    data_local._4_4_ = (uint)bVar1;
    break;
  case 0xc5:
    uVar2 = mp_load_u16(data);
    data_local._4_4_ = (uint)uVar2;
    break;
  case 0xc6:
    data_local._4_4_ = mp_load_u32(data);
    break;
  default:
    if (bVar1 < 0xa0 || 0xbf < bVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0xa94,"uint32_t mp_decode_strbinl(const char **)");
    }
    data_local._4_4_ = bVar1 & 0x1f;
    break;
  case 0xd9:
    bVar1 = mp_load_u8(data);
    data_local._4_4_ = (uint)bVar1;
    break;
  case 0xda:
    uVar2 = mp_load_u16(data);
    data_local._4_4_ = (uint)uVar2;
    break;
  case 0xdb:
    data_local._4_4_ = mp_load_u32(data);
  }
  return data_local._4_4_;
}

Assistant:

MP_IMPL uint32_t
mp_decode_strbinl(const char **data)
{
	uint8_t c = mp_load_u8(data);

	switch (c) {
	case 0xd9:
		return mp_load_u8(data);
	case 0xda:
		return mp_load_u16(data);
	case 0xdb:
		return mp_load_u32(data);
	case 0xc4:
		return mp_load_u8(data);
	case 0xc5:
		return mp_load_u16(data);
	case 0xc6:
		return mp_load_u32(data);
	default:
		if (mp_unlikely(c < 0xa0 || c > 0xbf))
			mp_unreachable();
		return c & 0x1f;
	}
}